

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodeFMOVLaneInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint32_t uVar1;
  uint IsToVec;
  uint Rn;
  uint Rd;
  void *Decoder_local;
  uint64_t Address_local;
  uint Insn_local;
  MCInst *Inst_local;
  
  RegNo = fieldFromInstruction(Insn,0,5);
  RegNo_00 = fieldFromInstruction(Insn,5,5);
  uVar1 = fieldFromInstruction(Insn,0x10,1);
  if (uVar1 == 0) {
    DecodeGPR64RegisterClass(Inst,RegNo,Address,Decoder);
    DecodeFPR128RegisterClass(Inst,RegNo_00,Address,Decoder);
  }
  else {
    DecodeFPR128RegisterClass(Inst,RegNo,Address,Decoder);
    DecodeGPR64RegisterClass(Inst,RegNo_00,Address,Decoder);
  }
  MCOperand_CreateImm0(Inst,1);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeFMOVLaneInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address,
		void *Decoder)
{
	// This decoder exists to add the dummy Lane operand to the MCInst, which must
	// be 1 in assembly but has no other real manifestation.
	unsigned Rd = fieldFromInstruction(Insn, 0, 5);
	unsigned Rn = fieldFromInstruction(Insn, 5, 5);
	unsigned IsToVec = fieldFromInstruction(Insn, 16, 1);

	if (IsToVec) {
		DecodeFPR128RegisterClass(Inst, Rd, Address, Decoder);
		DecodeGPR64RegisterClass(Inst, Rn, Address, Decoder);
	} else {
		DecodeGPR64RegisterClass(Inst, Rd, Address, Decoder);
		DecodeFPR128RegisterClass(Inst, Rn, Address, Decoder);
	}

	// Add the lane
	MCOperand_CreateImm0(Inst, 1);

	return Success;
}